

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

xmlChar * xmlDictAddQString(xmlDictPtr dict,xmlChar *prefix,uint plen,xmlChar *name,uint namelen)

{
  ulong uVar1;
  xmlChar *pxVar2;
  ulong uVar3;
  xmlDictStringsPtr_conflict pxVar4;
  ulong uVar5;
  xmlChar *__dest;
  
  pxVar4 = dict->strings;
  if (pxVar4 != (xmlDictStringsPtr_conflict)0x0) {
    uVar5 = 0;
    uVar3 = 0;
    do {
      __dest = pxVar4->free;
      if ((ulong)(namelen + plen + 1) < (ulong)((long)pxVar4->end - (long)__dest))
      goto LAB_0012c153;
      uVar1 = pxVar4->size;
      if (uVar3 < uVar1) {
        uVar3 = uVar1;
      }
      pxVar4 = pxVar4->next;
      uVar5 = uVar5 + uVar1;
    } while (pxVar4 != (xmlDictStringsPtr)0x0);
    if ((dict->limit != 0) && (dict->limit < uVar5)) {
      return (xmlChar *)0x0;
    }
    if (uVar3 != 0) {
      uVar3 = uVar3 << 2;
      goto LAB_0012c0f4;
    }
  }
  uVar3 = 1000;
LAB_0012c0f4:
  uVar5 = (ulong)((namelen + plen) * 4 + 4);
  if (uVar5 < uVar3) {
    uVar5 = uVar3;
  }
  pxVar4 = (xmlDictStringsPtr_conflict)(*xmlMalloc)(uVar5 + 0x30);
  if (pxVar4 == (xmlDictStringsPtr_conflict)0x0) {
    return (xmlChar *)0x0;
  }
  pxVar4->size = uVar5;
  pxVar4->nbStrings = 0;
  __dest = pxVar4->array;
  pxVar4->free = __dest;
  pxVar4->end = pxVar4->array + uVar5;
  pxVar4->next = dict->strings;
  dict->strings = pxVar4;
LAB_0012c153:
  memcpy(__dest,prefix,(ulong)plen);
  pxVar2 = pxVar4->free;
  pxVar4->free = pxVar2 + plen + 1;
  pxVar2[plen] = ':';
  memcpy(pxVar4->free,name,(ulong)namelen);
  pxVar2 = pxVar4->free;
  pxVar4->free = pxVar2 + namelen + 1;
  pxVar2[namelen] = '\0';
  pxVar4->nbStrings = pxVar4->nbStrings + 1;
  return __dest;
}

Assistant:

static const xmlChar *
xmlDictAddQString(xmlDictPtr dict, const xmlChar *prefix, unsigned int plen,
                 const xmlChar *name, unsigned int namelen)
{
    xmlDictStringsPtr pool;
    const xmlChar *ret;
    size_t size = 0; /* + sizeof(_xmlDictStrings) == 1024 */
    size_t limit = 0;

    pool = dict->strings;
    while (pool != NULL) {
	if ((size_t)(pool->end - pool->free) > namelen + plen + 1)
	    goto found_pool;
	if (pool->size > size) size = pool->size;
        limit += pool->size;
	pool = pool->next;
    }
    /*
     * Not found, need to allocate
     */
    if (pool == NULL) {
        if ((dict->limit > 0) && (limit > dict->limit)) {
            return(NULL);
        }

        if (size == 0) size = 1000;
	else size *= 4; /* exponential growth */
        if (size < 4 * (namelen + plen + 1))
	    size = 4 * (namelen + plen + 1); /* just in case ! */
	pool = (xmlDictStringsPtr) xmlMalloc(sizeof(xmlDictStrings) + size);
	if (pool == NULL)
	    return(NULL);
	pool->size = size;
	pool->nbStrings = 0;
	pool->free = &pool->array[0];
	pool->end = &pool->array[size];
	pool->next = dict->strings;
	dict->strings = pool;
    }
found_pool:
    ret = pool->free;
    memcpy(pool->free, prefix, plen);
    pool->free += plen;
    *(pool->free++) = ':';
    memcpy(pool->free, name, namelen);
    pool->free += namelen;
    *(pool->free++) = 0;
    pool->nbStrings++;
    return(ret);
}